

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_reader.cpp
# Opt level: O3

bool __thiscall diffusion::Tokenizer::pop(Tokenizer *this,vector<char,_std::allocator<char>_> *data)

{
  mutex *__mutex;
  vector<char,_std::allocator<char>_> *__x;
  vector<char,_std::allocator<char>_> *pvVar1;
  int iVar2;
  undefined8 uVar3;
  
  __mutex = &this->queue_mutex_;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    __x = (this->processed_data_queue_).
          super__Deque_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur;
    pvVar1 = (this->processed_data_queue_).
             super__Deque_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar1 != __x) {
      std::vector<char,_std::allocator<char>_>::operator=(data,__x);
      std::
      deque<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::pop_front(&this->processed_data_queue_);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return pvVar1 != __x;
  }
  uVar3 = std::__throw_system_error(iVar2);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar3);
}

Assistant:

bool pop(std::vector<char> &data) {
        std::lock_guard<std::mutex> lock(queue_mutex_);
        if (processed_data_queue_.empty()) {
            return false;
        } else {
            data = processed_data_queue_.front();
            processed_data_queue_.pop_front();
            return true;
        }
    }